

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O3

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen7TextureCalc::Get2DTexOffsetAddressPerMip
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  uint32_t uVar1;
  uint uVar2;
  GMM_PLATFORM_INFO *pGVar3;
  uint32_t NumSamples;
  ulong uVar4;
  uint32_t Height;
  int iVar5;
  uint uVar6;
  uint32_t local_5c;
  ulong uStack_58;
  uint32_t CompressDepth;
  uint local_4c;
  uint local_48;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint8_t local_31;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return 1;
  }
  _CompressWidth = pTexInfo;
  pGVar3 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  uVar1 = (_CompressWidth->Alignment).HAlign;
  CompressHeight = (_CompressWidth->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,_CompressWidth->Format,&local_48,&local_4c,&local_5c);
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,_CompressWidth->Format);
  Height = _CompressWidth->BaseHeight;
  if (MipLevel < 2) {
    uStack_58 = 0;
    iVar5 = 0;
    if (MipLevel == 0) goto LAB_001a4add;
  }
  else {
    if (((ulong)(_CompressWidth->Flags).Gpu & 0x20000040) == 0) {
      NumSamples = 1;
    }
    else {
      NumSamples = (_CompressWidth->MSAA).NumSamples;
    }
    uVar1 = GmmTextureCalc::ExpandWidth
                      (&this->super_GmmTextureCalc,(uint)_CompressWidth->BaseWidth >> 1,uVar1,
                       NumSamples);
    if (local_31 == '\0') {
      uVar6 = uVar1 << ((byte)((uint)*(undefined4 *)&(_CompressWidth->Flags).Gpu >> 0x1d) & 1);
    }
    else {
      uVar2 = uVar1 / local_48;
      uVar6 = uVar2;
      if ((((((((this->super_GmmTextureCalc).pGmmLibContext)->WaTable).field_0x8 & 0x20) != 0) ||
           (((uint)(_CompressWidth->Flags).Wa & 0x20) != 0)) && (local_48 == 5)) &&
         (((uint)pGVar3->FormatTable[_CompressWidth->Format].field_0 & 1) != 0)) {
        if (_CompressWidth->BaseWidth == 1) {
          uVar6 = uVar2 + 3;
        }
        else {
          uVar4 = _CompressWidth->BaseWidth >> 1 & 0x7fffffff;
          uVar6 = uVar2 + 3;
          if (4 < (uint)(~((int)(uVar4 / 10) * 10) + (int)uVar4)) {
            uVar6 = uVar2;
          }
        }
      }
    }
    uStack_58 = (ulong)_CompressWidth->BitsPerPixel * (ulong)uVar6 >> 3;
  }
  uVar6 = 1;
  iVar5 = 0;
  do {
    uVar1 = 1;
    if (((ulong)(_CompressWidth->Flags).Gpu & 0x20000040) != 0) {
      uVar1 = (_CompressWidth->MSAA).NumSamples;
    }
    uVar1 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,Height,CompressHeight,uVar1);
    if (local_31 == '\0') {
      uVar2 = uVar1 >> ((byte)((uint)*(undefined4 *)&(_CompressWidth->Flags).Gpu >> 0x1d) & 1);
    }
    else {
      uVar2 = uVar1 / local_4c;
    }
    if (uVar6 == 2) {
      uVar2 = 0;
    }
    iVar5 = iVar5 + uVar2;
    Height = Height >> 1;
    uVar6 = uVar6 + 1;
  } while (uVar6 <= MipLevel);
LAB_001a4add:
  return (uint)(iVar5 * (int)_CompressWidth->Pitch) + uStack_58;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen7TextureCalc::Get2DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    GMM_GFX_SIZE_T MipOffset;
    uint32_t       AlignedMipHeight, i, MipHeight, OffsetHeight;
    uint32_t       HAlign, VAlign;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;
    uint8_t        Compress;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipHeight    = pTexInfo->BaseHeight;
    OffsetHeight = 0;

    // Mips 0 and 1 are on the left edge...
    if(MipLevel < 2)
    {
        MipOffset = 0;
    }
    else // Mip2 and beyond are to the right of Mip1...
    {
        uint32_t Mip1Width = GFX_ULONG_CAST(pTexInfo->BaseWidth) >> 1;

        Mip1Width = __GMM_EXPAND_WIDTH(this, Mip1Width, HAlign, pTexInfo);

        if(Compress)
        {
            Mip1Width /= CompressWidth;
            
	    if((pGmmLibContext->GetWaTable().WaAstcCorruptionForOddCompressedBlockSizeX || pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) && pPlatform->FormatTable[pTexInfo->Format].ASTC && CompressWidth == 5)
            {
                uint32_t Width1   = (pTexInfo->BaseWidth == 1) ? 1 : (GFX_ULONG_CAST(pTexInfo->BaseWidth) >> 1);
                uint32_t Modulo10 = Width1 % 10;
                if(Modulo10 >= 1 && Modulo10 <= CompressWidth)
                {
                    Mip1Width += 3;
                }
            }
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            Mip1Width *= 2;
        }

        MipOffset = (GMM_GFX_SIZE_T)Mip1Width * pTexInfo->BitsPerPixel >> 3;
    }

    for(i = 1; i <= MipLevel; i++)
    {
        AlignedMipHeight = GFX_ULONG_CAST(__GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo));

        if(Compress)
        {
            AlignedMipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            AlignedMipHeight /= 2;
        }

        OffsetHeight += ((i != 2) ? AlignedMipHeight : 0);

        MipHeight >>= 1;
    }

    MipOffset += OffsetHeight * GFX_ULONG_CAST(pTexInfo->Pitch);

    GMM_DPF_EXIT;
    return (MipOffset);
}